

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::restriction
          (MLCellLinOp *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  int in_ESI;
  long *in_RDI;
  IntVect ratio;
  int ncomp;
  IntVect *in_stack_000005b0;
  int in_stack_000005b8;
  int in_stack_000005bc;
  MultiFab *in_stack_000005c0;
  MultiFab *in_stack_000005c8;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffffd0;
  
  (**(code **)(*in_RDI + 0x28))();
  if (in_ESI < 1) {
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              (in_stack_ffffffffffffffd0,(size_type)in_RDI);
  }
  else {
    IntVect::IntVect((IntVect *)&stack0xffffffffffffffd0,2);
  }
  average_down(in_stack_000005c8,in_stack_000005c0,in_stack_000005bc,in_stack_000005b8,
               in_stack_000005b0);
  return;
}

Assistant:

void
MLCellLinOp::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    const int ncomp = getNComp();
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.restrict(crse);
#endif
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[cmglev-1];
    amrex::average_down(fine, crse, 0, ncomp, ratio);
}